

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR1.cpp
# Opt level: O0

void __thiscall LR::build(LR *this)

{
  mapped_type mVar1;
  int iVar2;
  bool bVar3;
  __type _Var4;
  ostream *poVar5;
  ulong uVar6;
  size_type sVar7;
  reference pvVar8;
  mapped_type *pmVar9;
  reference pvVar10;
  reference pvVar11;
  reference pbVar12;
  mapped_type *pmVar13;
  pair<int,_const_char_*> pVar14;
  pair<int,_const_char_*> local_308;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f8;
  int local_2d0 [2];
  pair<LR::actionStat,_int> local_2c8;
  _Base_ptr local_2c0;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b8;
  actionStat local_290;
  pair<LR::actionStat,_int> local_28c;
  int local_284;
  string local_280 [4];
  int m_1;
  string a_1;
  _Self local_260;
  _Self local_258;
  iterator it;
  vector<Prod,_std::allocator<Prod>_> g_prods;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_230;
  const_iterator local_228;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_220;
  actionStat local_1f4;
  pair<LR::actionStat,_int> local_1f0;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8;
  mapped_type local_1bc;
  string local_1b8 [4];
  int goto_index;
  string a;
  int local_194;
  undefined1 local_190 [4];
  int j_1;
  Prod prod;
  undefined1 local_f0 [4];
  int k;
  Item item_1;
  undefined1 local_d0 [4];
  int i_1;
  int local_a4;
  string local_a0 [4];
  int m;
  string X;
  string local_70 [32];
  undefined1 local_50 [8];
  Item goto_item;
  int j;
  int length;
  Item item;
  int i;
  LR *this_local;
  
  poVar5 = std::operator<<((ostream *)&std::cout,"build...");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  items(this);
  item.prods.super__Vector_base<Prod,_std::allocator<Prod>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  do {
    uVar6 = (ulong)item.prods.super__Vector_base<Prod,_std::allocator<Prod>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_;
    sVar7 = std::vector<Item,_std::allocator<Item>_>::size(&this->C);
    if (sVar7 <= uVar6) {
      for (item_1.prods.super__Vector_base<Prod,_std::allocator<Prod>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          uVar6 = (ulong)item_1.prods.super__Vector_base<Prod,_std::allocator<Prod>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_,
          sVar7 = std::vector<Item,_std::allocator<Item>_>::size(&this->C), uVar6 < sVar7;
          item_1.prods.super__Vector_base<Prod,_std::allocator<Prod>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               item_1.prods.super__Vector_base<Prod,_std::allocator<Prod>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        pvVar8 = std::vector<Item,_std::allocator<Item>_>::operator[]
                           (&this->C,(long)item_1.prods.
                                           super__Vector_base<Prod,_std::allocator<Prod>_>._M_impl.
                                           super__Vector_impl_data._M_end_of_storage._4_4_);
        Item::Item((Item *)local_f0,pvVar8);
        for (prod.attrs._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
            uVar6 = (ulong)prod.attrs._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
            sVar7 = std::vector<Prod,_std::allocator<Prod>_>::size
                              ((vector<Prod,_std::allocator<Prod>_> *)local_f0), uVar6 < sVar7;
            prod.attrs._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
                 prod.attrs._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1) {
          pvVar10 = std::vector<Prod,_std::allocator<Prod>_>::operator[]
                              ((vector<Prod,_std::allocator<Prod>_> *)local_f0,
                               (long)prod.attrs._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                     _4_4_);
          Prod::Prod((Prod *)local_190,pvVar10);
          for (local_194 = 0;
              sVar7 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&prod.field_0x18), (ulong)(long)local_194 < sVar7;
              local_194 = local_194 + 1) {
            pvVar11 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&prod.field_0x18,(long)local_194);
            bVar3 = std::operator==(pvVar11,".");
            if ((bVar3) &&
               (sVar7 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&prod.field_0x18), (ulong)(long)local_194 < sVar7 - 1)) {
              pvVar11 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&prod.field_0x18,(long)(local_194 + 1));
              std::__cxx11::string::string(local_1b8,(string *)pvVar11);
              bVar3 = isVt((string *)local_1b8);
              if (bVar3) {
                std::make_pair<int&,std::__cxx11::string&>
                          (&local_1e8,
                           (int *)((long)&item_1.prods.
                                          super__Vector_base<Prod,_std::allocator<Prod>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage + 4),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1b8);
                pmVar9 = std::
                         map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
                         ::operator[](&this->GOTO,&local_1e8);
                mVar1 = *pmVar9;
                std::
                pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~pair(&local_1e8);
                local_1f4 = SHIFT;
                local_1bc = mVar1;
                local_1f0 = std::make_pair<LR::actionStat,int&>(&local_1f4,&local_1bc);
                std::make_pair<int&,std::__cxx11::string&>
                          (&local_220,
                           (int *)((long)&item_1.prods.
                                          super__Vector_base<Prod,_std::allocator<Prod>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage + 4),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1b8);
                pmVar13 = std::
                          map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>_>_>_>
                          ::operator[](&this->ACTION,&local_220);
                std::pair<LR::actionStat,_int>::operator=(pmVar13,&local_1f0);
                std::
                pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~pair(&local_220);
              }
              std::__cxx11::string::~string(local_1b8);
            }
            else {
              pvVar11 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&prod.field_0x18,(long)local_194);
              bVar3 = std::operator==(pvVar11,".");
              if (((bVar3) &&
                  (sVar7 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&prod.field_0x18), (long)local_194 == sVar7 - 1)) &&
                 (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_190,"S\'"), bVar3)) {
                local_230._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&prod.field_0x18);
                __gnu_cxx::
                __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ::__normal_iterator<std::__cxx11::string*>
                          ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                            *)&local_228,&local_230);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&prod.field_0x18,local_228);
                std::vector<Prod,_std::allocator<Prod>_>::vector
                          ((vector<Prod,_std::allocator<Prod>_> *)&it,
                           (vector<Prod,_std::allocator<Prod>_> *)this);
                local_258._M_node =
                     (_Base_ptr)
                     std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&prod.right.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
                while( true ) {
                  local_260._M_node =
                       (_Base_ptr)
                       std::
                       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&prod.right.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  bVar3 = std::operator!=(&local_258,&local_260);
                  if (!bVar3) break;
                  pbVar12 = std::
                            _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator*(&local_258);
                  std::__cxx11::string::string(local_280,(string *)pbVar12);
                  for (local_284 = 0; uVar6 = (ulong)local_284,
                      sVar7 = std::vector<Prod,_std::allocator<Prod>_>::size
                                        ((vector<Prod,_std::allocator<Prod>_> *)&it), uVar6 < sVar7;
                      local_284 = local_284 + 1) {
                    pvVar10 = std::vector<Prod,_std::allocator<Prod>_>::operator[]
                                        ((vector<Prod,_std::allocator<Prod>_> *)&it,(long)local_284)
                    ;
                    _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_190,&pvVar10->noTerminal);
                    if (_Var4) {
                      pvVar10 = std::vector<Prod,_std::allocator<Prod>_>::operator[]
                                          ((vector<Prod,_std::allocator<Prod>_> *)&it,
                                           (long)local_284);
                      bVar3 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)&prod.field_0x18,&pvVar10->right);
                      if (bVar3) {
                        local_290 = REDUCE;
                        local_28c = std::make_pair<LR::actionStat,int&>(&local_290,&local_284);
                        std::make_pair<int&,std::__cxx11::string&>
                                  (&local_2b8,
                                   (int *)((long)&item_1.prods.
                                                  super__Vector_base<Prod,_std::allocator<Prod>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                          + 4),
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_280);
                        pmVar13 = std::
                                  map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>_>_>_>
                                  ::operator[](&this->ACTION,&local_2b8);
                        std::pair<LR::actionStat,_int>::operator=(pmVar13,&local_28c);
                        std::
                        pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~pair(&local_2b8);
                      }
                    }
                  }
                  std::__cxx11::string::~string(local_280);
                  local_2c0 = (_Base_ptr)
                              std::
                              _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator++(&local_258,0);
                }
                std::vector<Prod,_std::allocator<Prod>_>::~vector
                          ((vector<Prod,_std::allocator<Prod>_> *)&it);
              }
              else {
                pvVar11 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)&prod.field_0x18,(long)local_194);
                bVar3 = std::operator==(pvVar11,".");
                if (((bVar3) &&
                    (sVar7 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&prod.field_0x18), (long)local_194 == sVar7 - 1)) &&
                   (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_190,"S\'"), bVar3)) {
                  local_2d0[1] = 0;
                  local_2d0[0] = -1;
                  local_2c8 = std::make_pair<LR::actionStat,int>
                                        ((actionStat *)(local_2d0 + 1),local_2d0);
                  pVar14 = std::make_pair<int&,char_const(&)[2]>
                                     ((int *)((long)&item_1.prods.
                                                     super__Vector_base<Prod,_std::allocator<Prod>_>
                                                     ._M_impl.super__Vector_impl_data.
                                                     _M_end_of_storage + 4),(char (*) [2])"#");
                  local_308.second = pVar14.second;
                  local_308.first = pVar14.first;
                  std::
                  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::pair<int,_const_char_*,_true>(&local_2f8,&local_308);
                  pmVar13 = std::
                            map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>_>_>_>
                            ::operator[](&this->ACTION,&local_2f8);
                  std::pair<LR::actionStat,_int>::operator=(pmVar13,&local_2c8);
                  std::
                  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~pair(&local_2f8);
                }
              }
            }
          }
          Prod::~Prod((Prod *)local_190);
        }
        Item::~Item((Item *)local_f0);
      }
      poVar5 = std::operator<<((ostream *)&std::cout,"build...end");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      return;
    }
    pvVar8 = std::vector<Item,_std::allocator<Item>_>::operator[]
                       (&this->C,(long)item.prods.super__Vector_base<Prod,_std::allocator<Prod>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    Item::Item((Item *)&j,pvVar8);
    goto_item.prods.super__Vector_base<Prod,_std::allocator<Prod>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0x2c;
    for (goto_item.prods.super__Vector_base<Prod,_std::allocator<Prod>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        (int)goto_item.prods.super__Vector_base<Prod,_std::allocator<Prod>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage <
        goto_item.prods.super__Vector_base<Prod,_std::allocator<Prod>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_;
        goto_item.prods.super__Vector_base<Prod,_std::allocator<Prod>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ =
             (int)goto_item.prods.super__Vector_base<Prod,_std::allocator<Prod>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 1) {
      std::__cxx11::string::string
                (local_70,(string *)
                          (str_all_abi_cxx11_ +
                          (long)(int)goto_item.prods.super__Vector_base<Prod,_std::allocator<Prod>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage * 0x20));
      Goto((Item *)local_50,this,(Item *)&j,(string *)local_70);
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::string
                (local_a0,(string *)
                          (str_all_abi_cxx11_ +
                          (long)(int)goto_item.prods.super__Vector_base<Prod,_std::allocator<Prod>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage * 0x20));
      for (local_a4 = 0; uVar6 = (ulong)local_a4,
          sVar7 = std::vector<Item,_std::allocator<Item>_>::size(&this->C), uVar6 < sVar7;
          local_a4 = local_a4 + 1) {
        pvVar8 = std::vector<Item,_std::allocator<Item>_>::operator[](&this->C,(long)local_a4);
        bVar3 = Item::operator==((Item *)local_50,pvVar8);
        iVar2 = local_a4;
        if (bVar3) {
          std::make_pair<int&,std::__cxx11::string&>
                    ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_d0,
                     (int *)((long)&item.prods.super__Vector_base<Prod,_std::allocator<Prod>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (str_all_abi_cxx11_ +
                     (long)(int)goto_item.prods.super__Vector_base<Prod,_std::allocator<Prod>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage * 0x20));
          pmVar9 = std::
                   map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
                   ::operator[](&this->GOTO,(key_type *)local_d0);
          *pmVar9 = iVar2;
          std::
          pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_d0);
          break;
        }
      }
      std::__cxx11::string::~string(local_a0);
      Item::~Item((Item *)local_50);
    }
    Item::~Item((Item *)&j);
    item.prods.super__Vector_base<Prod,_std::allocator<Prod>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ =
         item.prods.super__Vector_base<Prod,_std::allocator<Prod>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_ + 1;
  } while( true );
}

Assistant:

void LR::build() { // 构造Action、GOTO表
    cout << "build..." << endl;
    items();
//    cout << "items end" << endl;

    for (int i = 0; i < C.size(); ++i) { // 逐个项目集
        Item item = C[i];
        //GOTO
        int length = sizeof(str_all) / sizeof(str_all[0]);
        for (int j = 0; j < length; j++) {
            Item goto_item = Goto(item, str_all[j]);
            string X = str_all[j];
            for (int m = 0; m < C.size(); m++) {
                if (goto_item == C[m]) {
                    GOTO[make_pair(i, str_all[j])] = m;
                    break;
                }
            }
        }
    }
    for (int i = 0; i < C.size(); ++i) { // 逐个项目集
        Item item = C[i];
        //Action
        for (int k = 0; k < item.prods.size(); k++) { // 逐个项目
            Prod prod = item.prods[k];
            for (int j = 0; j < prod.right.size(); j++) {
                if (prod.right[j] == "." && j < prod.right.size() - 1) {//A->α.aβ,b
                    string a = prod.right[j + 1];
                    if (isVt(a)) { // 终结符
                        int goto_index = GOTO[make_pair(i, a)];
                        ACTION[make_pair(i, a)] = make_pair(SHIFT, goto_index);
                    }
                } else if (prod.right[j] == "." && j == prod.right.size() - 1
                           && prod.noTerminal != "S'") {//A->α.,a
                    prod.right.erase(prod.right.end());//去掉最后的 . ,否则在后边的G文法项目比较的时候找不到相等的
                    vector<Prod> g_prods = G.prods;
                    for (set<string>::iterator it = prod.additionalVt.begin();
                         it != prod.additionalVt.end(); it++) {
                        string a = *it;
                        int m = 0;
                        for (m = 0; m < g_prods.size(); m++) {
                            if (prod.noTerminal == g_prods[m].noTerminal
                                && prod.right == g_prods[m].right) {
                                ACTION[make_pair(i, a)] = make_pair(REDUCE, m);
                            }
                        }
                    }
                } else if (prod.right[j] == "." && j == prod.right.size() - 1
                           && prod.noTerminal == "S'") {//A->α.,a
                    ACTION[make_pair(i, "#")] = make_pair(ACCEPT, -1);
                }
            }
        }

    }
    cout << "build...end" << endl;
}